

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_vcodec_client.c
# Opt level: O0

MPP_RET mpp_vcodec_ioctl(RK_S32 fd,RK_U32 cmd,RK_U32 ctrl_cmd,RK_U32 size,void *param)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  RK_U32 local_40;
  RK_S32 ret;
  vcodec_req req;
  void *param_local;
  RK_U32 size_local;
  RK_U32 ctrl_cmd_local;
  RK_U32 cmd_local;
  RK_S32 fd_local;
  
  req.data = (RK_U64)param;
  memset(&local_40,0,0x18);
  req._8_8_ = req.data;
  local_40 = cmd;
  ret = ctrl_cmd;
  req.cmd = size;
  uVar2 = ioctl(fd,0x40045601,&local_40);
  if (uVar2 == 0) {
    cmd_local = 0;
  }
  else {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    _mpp_log_l(2,"mpp_vcodec","ioctl fd %d failed ret %d errno %d %s\n",(char *)0x0,(ulong)(uint)fd,
               (ulong)uVar2,iVar1,pcVar4);
    cmd_local = 0xffffffff;
  }
  return cmd_local;
}

Assistant:

MPP_RET mpp_vcodec_ioctl(RK_S32 fd, RK_U32 cmd, RK_U32 ctrl_cmd, RK_U32 size, void *param)
{
    vcodec_req req;
    RK_S32 ret = 0;

    memset(&req, 0, sizeof(req));
    req.cmd = cmd;
    req.ctrl_cmd = ctrl_cmd;
    req.size = size;
    req.data = REQ_DATA_PTR(param);

    ret = (RK_S32)ioctl(fd, VOCDEC_IOC_CFG, &req);
    if (ret) {
        mpp_err("ioctl fd %d failed ret %d errno %d %s\n",
                fd, ret, errno, strerror(errno));
        return MPP_NOK;
    }

    return MPP_OK;
}